

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_real_literal(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_06;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_07;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_08;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_09;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_10;
  basic_variable<std::allocator<char>_> *local_f68;
  basic_variable<std::allocator<char>_> *local_f50;
  basic_variable<std::allocator<char>_> *local_f38;
  basic_variable<std::allocator<char>_> *local_f20;
  basic_variable<std::allocator<char>_> *local_ee8;
  basic_variable<std::allocator<char>_> *local_ed0;
  basic_variable<std::allocator<char>_> *local_eb8;
  basic_variable<std::allocator<char>_> *local_ea0;
  basic_variable<std::allocator<char>_> *local_e68;
  basic_variable<std::allocator<char>_> *local_e50;
  basic_variable<std::allocator<char>_> *local_e38;
  basic_variable<std::allocator<char>_> *local_e20;
  undefined1 local_df1;
  basic_variable<std::allocator<char>_> *local_df0;
  basic_variable<std::allocator<char>_> local_de8;
  basic_variable<std::allocator<char>_> local_db8;
  basic_variable<std::allocator<char>_> local_d88;
  undefined1 local_d58 [69];
  undefined1 local_d13 [2];
  undefined1 local_d11;
  basic_variable<std::allocator<char>_> *local_d10;
  basic_variable<std::allocator<char>_> local_d08;
  basic_variable<std::allocator<char>_> local_cd8;
  basic_variable<std::allocator<char>_> local_ca8;
  undefined1 local_c78 [69];
  undefined1 local_c33 [2];
  undefined1 local_c31;
  basic_variable<std::allocator<char>_> *local_c30;
  basic_variable<std::allocator<char>_> local_c28;
  basic_variable<std::allocator<char>_> local_bf8;
  basic_variable<std::allocator<char>_> local_bc8;
  undefined1 local_b98 [69];
  undefined1 local_b53 [2];
  undefined1 local_b51;
  basic_variable<std::allocator<char>_> *local_b50;
  basic_variable<std::allocator<char>_> local_b48;
  basic_variable<std::allocator<char>_> local_b18;
  basic_variable<std::allocator<char>_> local_ae8;
  undefined1 local_ab8 [77];
  undefined1 local_a6b [2];
  undefined1 local_a69;
  basic_variable<std::allocator<char>_> local_a68;
  undefined1 local_a2b [2];
  undefined1 local_a29;
  basic_variable<std::allocator<char>_> local_a28;
  undefined1 local_9eb [2];
  undefined1 local_9e9;
  basic_variable<std::allocator<char>_> local_9e8;
  undefined1 local_9ab [2];
  undefined1 local_9a9;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_96a [2];
  undefined1 auStack_968 [8];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_941;
  basic_variable<std::allocator<char>_> *local_940;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> local_908;
  basic_variable<std::allocator<char>_> local_8d8;
  undefined1 local_8a8 [69];
  undefined1 local_863 [2];
  undefined1 local_861;
  basic_variable<std::allocator<char>_> *local_860;
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  basic_variable<std::allocator<char>_> local_7f8;
  undefined1 local_7c8 [69];
  undefined1 local_783 [2];
  undefined1 local_781;
  basic_variable<std::allocator<char>_> *local_780;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6e8 [69];
  undefined1 local_6a3 [2];
  undefined1 local_6a1;
  basic_variable<std::allocator<char>_> *local_6a0;
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  basic_variable<std::allocator<char>_> local_638;
  undefined1 local_608 [77];
  undefined1 local_5bb [2];
  undefined1 local_5b9;
  basic_variable<std::allocator<char>_> local_5b8;
  undefined1 local_57b [2];
  undefined1 local_579;
  basic_variable<std::allocator<char>_> local_578;
  undefined1 local_53b [2];
  undefined1 local_539;
  basic_variable<std::allocator<char>_> local_538;
  undefined1 local_4fb [2];
  undefined1 local_4f9;
  basic_variable<std::allocator<char>_> local_4f8;
  undefined1 local_4ba [2];
  double local_4b8;
  double big_1;
  double zero_1;
  basic_variable<std::allocator<char>_> *local_4a0;
  basic_variable<std::allocator<char>_> local_498;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_408 [69];
  undefined1 local_3c3 [2];
  undefined1 local_3c1;
  basic_variable<std::allocator<char>_> *local_3c0;
  basic_variable<std::allocator<char>_> local_3b8;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_328 [69];
  undefined1 local_2e3 [2];
  undefined1 local_2e1;
  basic_variable<std::allocator<char>_> *local_2e0;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_248 [69];
  undefined1 local_203 [2];
  undefined1 local_201;
  basic_variable<std::allocator<char>_> *local_200;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_168 [77];
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  float local_c;
  float big;
  float zero;
  
  local_c = 0.0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_12[0] = trial::dynamic::operator==(&local_48,&local_c);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce0,"void equality_suite::compare_array_equal_real_literal()",local_12,&local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_c);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce1,"void equality_suite::compare_array_equal_real_literal()",local_5e,&local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9b[0] = trial::dynamic::operator==(&local_d8,&local_10);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce2,"void equality_suite::compare_array_equal_real_literal()",local_9b,&local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_db[0] = trial::dynamic::operator!=(&local_118,&local_10);
  local_119 = 1;
  sVar1 = 0xce3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce3,"void equality_suite::compare_array_equal_real_literal()",local_db,&local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_200 = &local_1f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,1);
  local_200 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,2);
  local_200 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_200,3);
  local_168._0_8_ = &local_1f8;
  local_168._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_array<std::allocator<char>_> *)local_168._0_8_,init);
  local_11b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),&local_c);
  local_201 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce5,"void equality_suite::compare_array_equal_real_literal()",local_11b,&local_201);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  pbVar2 = &local_1f8;
  local_e20 = (basic_variable<std::allocator<char>_> *)local_168;
  do {
    local_e20 = local_e20 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e20);
  } while (local_e20 != pbVar2);
  local_2e0 = &local_2d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,1);
  local_2e0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,2);
  local_2e0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2e0,3);
  local_248._0_8_ = &local_2d8;
  local_248._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_array<std::allocator<char>_> *)local_248._0_8_,init_00);
  local_203[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),&local_c);
  local_2e1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce6,"void equality_suite::compare_array_equal_real_literal()",local_203,&local_2e1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  pbVar2 = &local_2d8;
  local_e38 = (basic_variable<std::allocator<char>_> *)local_248;
  do {
    local_e38 = local_e38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e38);
  } while (local_e38 != pbVar2);
  local_3c0 = &local_3b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,1);
  local_3c0 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,2);
  local_3c0 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3c0,3);
  local_328._0_8_ = &local_3b8;
  local_328._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),
             (basic_array<std::allocator<char>_> *)local_328._0_8_,init_01);
  local_2e3[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10),&local_10);
  local_3c1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce7,"void equality_suite::compare_array_equal_real_literal()",local_2e3,&local_3c1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_328 + 0x10));
  pbVar2 = &local_3b8;
  local_e50 = (basic_variable<std::allocator<char>_> *)local_328;
  do {
    local_e50 = local_e50 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e50);
  } while (local_e50 != pbVar2);
  local_4a0 = &local_498;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,1);
  local_4a0 = &local_468;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,2);
  local_4a0 = &local_438;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4a0,3);
  local_408._0_8_ = &local_498;
  local_408._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),
             (basic_array<std::allocator<char>_> *)local_408._0_8_,init_02);
  local_3c3[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10),&local_10);
  zero_1._7_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xce8,"void equality_suite::compare_array_equal_real_literal()",local_3c3,
             (long)&zero_1 + 7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_408 + 0x10));
  local_e68 = (basic_variable<std::allocator<char>_> *)local_408;
  do {
    local_e68 = local_e68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_e68);
  } while (local_e68 != &local_498);
  big_1 = 0.0;
  local_4b8 = std::numeric_limits<double>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_4ba[0] = trial::dynamic::operator==(&local_4f8,&big_1);
  local_4f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcee,"void equality_suite::compare_array_equal_real_literal()",local_4ba,&local_4f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4f8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_4fb[0] = trial::dynamic::operator!=(&local_538,&big_1);
  local_539 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcef,"void equality_suite::compare_array_equal_real_literal()",local_4fb,&local_539);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_538);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_53b[0] = trial::dynamic::operator==(&local_578,&local_4b8);
  local_579 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf0,"void equality_suite::compare_array_equal_real_literal()",local_53b,&local_579);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_578);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_57b[0] = trial::dynamic::operator!=(&local_5b8,&local_4b8);
  local_5b9 = 1;
  sVar1 = 0xcf1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf1,"void equality_suite::compare_array_equal_real_literal()",local_57b,&local_5b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  local_6a0 = &local_698;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_6a0,1);
  local_6a0 = &local_668;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_6a0,2);
  local_6a0 = &local_638;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_6a0,3);
  local_608._0_8_ = &local_698;
  local_608._8_8_ = 3;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_608 + 0x10),
             (basic_array<std::allocator<char>_> *)local_608._0_8_,init_03);
  local_5bb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_608 + 0x10),&big_1);
  local_6a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf3,"void equality_suite::compare_array_equal_real_literal()",local_5bb,&local_6a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_608 + 0x10));
  pbVar2 = &local_698;
  local_ea0 = (basic_variable<std::allocator<char>_> *)local_608;
  do {
    local_ea0 = local_ea0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ea0);
  } while (local_ea0 != pbVar2);
  local_780 = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_780,1);
  local_780 = &local_748;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_780,2);
  local_780 = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_780,3);
  local_6e8._0_8_ = &local_778;
  local_6e8._8_8_ = 3;
  init_04._M_len = (size_type)pbVar2;
  init_04._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6e8._0_8_,init_04);
  local_6a3[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10),&big_1);
  local_781 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf4,"void equality_suite::compare_array_equal_real_literal()",local_6a3,&local_781);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6e8 + 0x10));
  pbVar2 = &local_778;
  local_eb8 = (basic_variable<std::allocator<char>_> *)local_6e8;
  do {
    local_eb8 = local_eb8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_eb8);
  } while (local_eb8 != pbVar2);
  local_860 = &local_858;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_860,1);
  local_860 = &local_828;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_860,2);
  local_860 = &local_7f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_860,3);
  local_7c8._0_8_ = &local_858;
  local_7c8._8_8_ = 3;
  init_05._M_len = (size_type)pbVar2;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_7c8._0_8_,init_05);
  local_783[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_7c8 + 0x10),&local_4b8);
  local_861 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf5,"void equality_suite::compare_array_equal_real_literal()",local_783,&local_861);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7c8 + 0x10));
  pbVar2 = &local_858;
  local_ed0 = (basic_variable<std::allocator<char>_> *)local_7c8;
  do {
    local_ed0 = local_ed0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ed0);
  } while (local_ed0 != pbVar2);
  local_940 = &local_938;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_940,1);
  local_940 = &local_908;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_940,2);
  local_940 = &local_8d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_940,3);
  local_8a8._0_8_ = &local_938;
  local_8a8._8_8_ = 3;
  init_06._M_len = (size_type)pbVar2;
  init_06._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_8a8._0_8_,init_06);
  local_863[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10),&local_4b8);
  local_941 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcf6,"void equality_suite::compare_array_equal_real_literal()",local_863,&local_941);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_8a8 + 0x10));
  local_ee8 = (basic_variable<std::allocator<char>_> *)local_8a8;
  do {
    local_ee8 = local_ee8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_ee8);
  } while (local_ee8 != &local_938);
  unique0x00076c00 = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_96a[0] = trial::dynamic::operator==(&local_9a8,(longdouble *)((long)&big_2 + 8));
  local_9a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcfc,"void equality_suite::compare_array_equal_real_literal()",local_96a,&local_9a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9ab[0] = trial::dynamic::operator!=(&local_9e8,(longdouble *)((long)&big_2 + 8));
  local_9e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcfd,"void equality_suite::compare_array_equal_real_literal()",local_9ab,&local_9e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_9eb[0] = trial::dynamic::operator==(&local_a28,(longdouble *)auStack_968);
  local_a29 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcfe,"void equality_suite::compare_array_equal_real_literal()",local_9eb,&local_a29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a28);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_a2b[0] = trial::dynamic::operator!=(&local_a68,(longdouble *)auStack_968);
  local_a69 = 1;
  sVar1 = 0xcff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xcff,"void equality_suite::compare_array_equal_real_literal()",local_a2b,&local_a69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a68);
  local_b50 = &local_b48;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b50,1);
  local_b50 = &local_b18;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b50,2);
  local_b50 = &local_ae8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b50,3);
  local_ab8._0_8_ = &local_b48;
  local_ab8._8_8_ = 3;
  init_07._M_len = sVar1;
  init_07._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ab8._0_8_,init_07);
  local_a6b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10),
                            (longdouble *)((long)&big_2 + 8));
  local_b51 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd01,"void equality_suite::compare_array_equal_real_literal()",local_a6b,&local_b51);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ab8 + 0x10));
  pbVar2 = &local_b48;
  local_f20 = (basic_variable<std::allocator<char>_> *)local_ab8;
  do {
    local_f20 = local_f20 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_f20);
  } while (local_f20 != pbVar2);
  local_c30 = &local_c28;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c30,1);
  local_c30 = &local_bf8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c30,2);
  local_c30 = &local_bc8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_c30,3);
  local_b98._0_8_ = &local_c28;
  local_b98._8_8_ = 3;
  init_08._M_len = (size_type)pbVar2;
  init_08._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_b98._0_8_,init_08);
  local_b53[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_b98 + 0x10),
                            (longdouble *)((long)&big_2 + 8));
  local_c31 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd02,"void equality_suite::compare_array_equal_real_literal()",local_b53,&local_c31);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b98 + 0x10));
  pbVar2 = &local_c28;
  local_f38 = (basic_variable<std::allocator<char>_> *)local_b98;
  do {
    local_f38 = local_f38 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_f38);
  } while (local_f38 != pbVar2);
  local_d10 = &local_d08;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d10,1);
  local_d10 = &local_cd8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d10,2);
  local_d10 = &local_ca8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_d10,3);
  local_c78._0_8_ = &local_d08;
  local_c78._8_8_ = 3;
  init_09._M_len = (size_type)pbVar2;
  init_09._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_c78 + 0x10),
             (basic_array<std::allocator<char>_> *)local_c78._0_8_,init_09);
  local_c33[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_c78 + 0x10),
                            (longdouble *)auStack_968);
  local_d11 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd03,"void equality_suite::compare_array_equal_real_literal()",local_c33,&local_d11);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_c78 + 0x10));
  pbVar2 = &local_d08;
  local_f50 = (basic_variable<std::allocator<char>_> *)local_c78;
  do {
    local_f50 = local_f50 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_f50);
  } while (local_f50 != pbVar2);
  local_df0 = &local_de8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_df0,1);
  local_df0 = &local_db8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_df0,2);
  local_df0 = &local_d88;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_df0,3);
  local_d58._0_8_ = &local_de8;
  local_d58._8_8_ = 3;
  init_10._M_len = (size_type)pbVar2;
  init_10._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10),
             (basic_array<std::allocator<char>_> *)local_d58._0_8_,init_10);
  local_d13[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10),
                            (longdouble *)auStack_968);
  local_df1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd04,"void equality_suite::compare_array_equal_real_literal()",local_d13,&local_df1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_d58 + 0x10));
  local_f68 = (basic_variable<std::allocator<char>_> *)local_d58;
  do {
    local_f68 = local_f68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_f68);
  } while (local_f68 != &local_de8);
  return;
}

Assistant:

void compare_array_equal_real_literal()
{
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != big, true);
    }
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != big, true);
    }
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != big, true);
    }
}